

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

int ON_WindingNumber::Internal_SignOfY(ON_2dPoint *p,ON_2dPoint *q)

{
  int iVar1;
  double dVar2;
  
  dVar2 = p->x * q->y - q->x * p->y;
  iVar1 = 1;
  if (0.0 <= dVar2) {
    iVar1 = -(uint)(0.0 < dVar2);
  }
  return iVar1;
}

Assistant:

int ON_WindingNumber::Internal_SignOfY(const ON_2dPoint& p, const ON_2dPoint& q)
{
  // Input: p and q are 2d points with p.x <= 0 and q.x > 0
  //
  // Returns:
  //   Sign of the y coordinate of the intersection of the line segment from p to q 
  //   and the y axis.
  //
  // Arithmetic:
  //  L = segment from p to q.
  //  L crosses the y-axis (x=0)
  //  L(t) = (1-t)*P + t*Q;
  //  When t = p.x/(p.x-q.x), L(t).x == 0
  //  (1-t) = (-q.x/(p.x-q.x))
  //  L(t).y = (-q.x/(p.x-q.x))*p.y + (p.x/(p.x-q.x))*q.y
  //         = (p.x*q.y - p.y*q.x)/(p.x-q.x)
  //  Since (p.x <= 0 and q.x > 0), (p.x-q.x) < 0
  //  Therefore 
  //     L(t).y < 0 if and only if (p.x*q.y - p.y*q.x) > 0.
  //     L(t).y > 0 if and only if (p.x*q.y - p.y*q.x) < 0.
  const double y = (p.x*q.y) - (p.y*q.x);
  if (y < 0.0)
    return 1;
  if (y > 0.0)
    return -1;
  return 0;
}